

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_int.c
# Opt level: O0

int a2i_ASN1_INTEGER(BIO *bp,ASN1_INTEGER *bs,char *buf,int size)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int first;
  int slen;
  int num;
  uchar *bufp;
  uchar *sp;
  uchar *s;
  int bufsize;
  int again;
  int n;
  int m;
  int k;
  int j;
  int i;
  int line;
  int iVar4;
  int iVar5;
  char *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffb0;
  uchar *str;
  int local_40;
  int local_38;
  int local_30;
  int local_2c;
  int local_28;
  
  str = (uchar *)0x0;
  iVar5 = 0;
  iVar4 = 0;
  line = 1;
  bs->type = 2;
  local_40 = BIO_gets(bp,buf,size);
  while (iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20), 0 < local_40) {
    local_28 = local_40;
    if (buf[local_40 + -1] == '\n') {
      local_28 = local_40 + -1;
      buf[local_28] = '\0';
    }
    if (local_28 == 0) break;
    if (buf[local_28 + -1] == '\r') {
      local_28 = local_28 + -1;
      buf[local_28] = '\0';
    }
    if (local_28 == 0) break;
    cVar1 = buf[local_28 + -1];
    for (local_2c = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20), local_2c < local_28;
        local_2c = local_2c + 1) {
      iVar2 = ossl_ctype_check((int)buf[local_2c],0x10);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      if (iVar2 == 0) {
        local_28 = local_2c;
        break;
      }
    }
    buf[local_28] = '\0';
    if (local_28 < 2) break;
    in_stack_ffffffffffffffa8 = buf;
    if (((line != 0) && (line = 0, *buf == '0')) && (buf[1] == '0')) {
      in_stack_ffffffffffffffa8 = buf + 2;
      local_28 = local_28 + -2;
    }
    local_30 = 0;
    local_28 = local_28 - (uint)(cVar1 == '\\');
    if (local_28 % 2 != 0) {
      ERR_new();
      ERR_set_debug((char *)in_stack_ffffffffffffffb0,
                    (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(char *)CONCAT44(iVar5,iVar4));
      ERR_set_error(0xd,0x91,(char *)0x0);
      CRYPTO_free(str);
      return 0;
    }
    local_28 = local_28 / 2;
    if (iVar4 < iVar5 + local_28) {
      in_stack_ffffffffffffffb0 =
           (uchar *)CRYPTO_clear_realloc
                              (str,(size_t)in_stack_ffffffffffffffb0,
                               (size_t)in_stack_ffffffffffffffa8,(char *)CONCAT44(iVar5,iVar4),line)
      ;
      if (in_stack_ffffffffffffffb0 == (uchar *)0x0) {
        ERR_new();
        ERR_set_debug((char *)in_stack_ffffffffffffffb0,
                      (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(char *)CONCAT44(iVar5,iVar4))
        ;
        ERR_set_error(0xd,0xc0100,(char *)0x0);
        CRYPTO_free(str);
        return 0;
      }
      iVar4 = iVar5 + local_28 * 2;
      str = in_stack_ffffffffffffffb0;
    }
    for (local_2c = 0; local_2c < local_28; local_2c = local_2c + 1) {
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        iVar3 = OPENSSL_hexchar2int(in_stack_ffffffffffffffa8[local_30 + local_38]);
        if (iVar3 < 0) {
          ERR_new();
          iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
          ERR_set_debug((char *)in_stack_ffffffffffffffb0,iVar3,(char *)CONCAT44(iVar5,iVar4));
          ERR_set_error(0xd,0x8d,(char *)0x0);
          goto LAB_004b871b;
        }
        str[iVar5 + local_2c] = str[iVar5 + local_2c] << 4;
        str[iVar5 + local_2c] = str[iVar5 + local_2c] | (byte)iVar3;
      }
      local_30 = local_30 + 2;
    }
    iVar5 = local_28 + iVar5;
    if ((cVar1 == '\\') == 0) {
      bs->length = iVar5;
      bs->data = str;
      return 1;
    }
    local_40 = BIO_gets(bp,buf,size);
  }
LAB_004b871b:
  ERR_new();
  ERR_set_debug((char *)in_stack_ffffffffffffffb0,iVar3,(char *)CONCAT44(iVar5,iVar4));
  ERR_set_error(0xd,0x96,(char *)0x0);
  CRYPTO_free(str);
  return 0;
}

Assistant:

int a2i_ASN1_INTEGER(BIO *bp, ASN1_INTEGER *bs, char *buf, int size)
{
    int i, j, k, m, n, again, bufsize;
    unsigned char *s = NULL, *sp;
    unsigned char *bufp;
    int num = 0, slen = 0, first = 1;

    bs->type = V_ASN1_INTEGER;

    bufsize = BIO_gets(bp, buf, size);
    for (;;) {
        if (bufsize < 1)
            goto err;
        i = bufsize;
        if (buf[i - 1] == '\n')
            buf[--i] = '\0';
        if (i == 0)
            goto err;
        if (buf[i - 1] == '\r')
            buf[--i] = '\0';
        if (i == 0)
            goto err;
        again = (buf[i - 1] == '\\');

        for (j = 0; j < i; j++) {
            if (!ossl_isxdigit(buf[j]))
            {
                i = j;
                break;
            }
        }
        buf[i] = '\0';
        /*
         * We have now cleared all the crap off the end of the line
         */
        if (i < 2)
            goto err;

        bufp = (unsigned char *)buf;
        if (first) {
            first = 0;
            if ((bufp[0] == '0') && (bufp[1] == '0')) {
                bufp += 2;
                i -= 2;
            }
        }
        k = 0;
        i -= again;
        if (i % 2 != 0) {
            ERR_raise(ERR_LIB_ASN1, ASN1_R_ODD_NUMBER_OF_CHARS);
            OPENSSL_free(s);
            return 0;
        }
        i /= 2;
        if (num + i > slen) {
            sp = OPENSSL_clear_realloc(s, slen, num + i * 2);
            if (sp == NULL) {
                ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
                OPENSSL_free(s);
                return 0;
            }
            s = sp;
            slen = num + i * 2;
        }
        for (j = 0; j < i; j++, k += 2) {
            for (n = 0; n < 2; n++) {
                m = OPENSSL_hexchar2int(bufp[k + n]);
                if (m < 0) {
                    ERR_raise(ERR_LIB_ASN1, ASN1_R_NON_HEX_CHARACTERS);
                    goto err;
                }
                s[num + j] <<= 4;
                s[num + j] |= m;
            }
        }
        num += i;
        if (again)
            bufsize = BIO_gets(bp, buf, size);
        else
            break;
    }
    bs->length = num;
    bs->data = s;
    return 1;
 err:
    ERR_raise(ERR_LIB_ASN1, ASN1_R_SHORT_LINE);
    OPENSSL_free(s);
    return 0;
}